

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_03.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  int number2;
  int number1;
  int local_30;
  int local_2c;
  
  std::operator<<((ostream *)&std::cout,"Enter first integer: ");
  std::istream::operator>>((istream *)&std::cin,&local_2c);
  std::operator<<((ostream *)&std::cout,"Enter second integer: ");
  std::istream::operator>>((istream *)&std::cin,&local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,"Sum is ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_30 + local_2c);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main(int argc, const char *argv[]) {
    // variable declarations
    int number1;  // first integer to add
    int number2;  // second integer to add
    int sum;      // sum of number1 and number2

    std::cout << "Enter first integer: ";  // prompt user for data
    std::cin >> number1;  // read the first integer from user into number1

    std::cout << "Enter second integer: ";  // prompt user for data
    std::cin >> number2;  // read the second integer from user into number2

    sum = number1 + number2;

    std::cout << "Sum is " << sum << std::endl;

    return 0;
}